

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexeme.h
# Opt level: O0

void __thiscall
SGParser::Lexeme::SetLexeme(Lexeme *this,String *name,String *regExpr,uint tokenCode)

{
  LexemeInfo LVar1;
  uint tokenCode_local;
  String *regExpr_local;
  String *name_local;
  Lexeme *this_local;
  
  std::__cxx11::string::operator=((string *)this,(string *)name);
  std::__cxx11::string::operator=((string *)&this->RegularExpression,(string *)regExpr);
  LVar1.Action = 0;
  LVar1.TokenCode = tokenCode;
  this->Info = LVar1;
  std::__cxx11::string::clear();
  return;
}

Assistant:

void SetLexeme(const String& name, const String& regExpr, unsigned tokenCode = 0u) {
        Name              = name;
        RegularExpression = regExpr;
        Info              = {tokenCode, LexemeInfo::ActionNone};
        ActionParam.clear();
    }